

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# swapimpl.cpp
# Opt level: O0

int32_t test_swap(UDataSwapper *ds,void *inData,int32_t length,void *outData,UErrorCode *pErrorCode)

{
  UBool UVar1;
  int32_t iVar2;
  char *local_78;
  int32_t size;
  int32_t sizeStr;
  int32_t size16;
  int32_t offset;
  uint8_t *outBytes;
  uint8_t *inBytes;
  int32_t headerSize;
  UDataInfo *pInfo;
  UErrorCode *pErrorCode_local;
  void *outData_local;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  iVar2 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
  if ((pErrorCode == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*pErrorCode), UVar1 != '\0')) {
    if (pErrorCode == (UErrorCode *)0x0) {
      local_78 = "pErrorCode is NULL";
    }
    else {
      local_78 = u_errorName_63(*pErrorCode);
    }
    udata_printError_63(ds,"test_swap(): data header swap failed %s\n",local_78);
    return 0;
  }
  if (((*(char *)((long)inData + 0xc) == 'T') &&
      (((*(char *)((long)inData + 0xd) == 'e' && (*(char *)((long)inData + 0xe) == 's')) &&
       (*(char *)((long)inData + 0xf) == 't')))) && (*(char *)((long)inData + 0x10) == '\x01')) {
    if (-1 < length) {
      if (length < 7) {
        udata_printError_63(ds,
                            "test_swap(): too few bytes (%d after header, wanted %d) for all of testdata\n"
                            ,(ulong)(uint)length,7);
        *pErrorCode = U_INDEX_OUTOFBOUNDS_ERROR;
        return 0;
      }
      (*ds->swapArray16)(ds,(void *)((long)inData + (long)iVar2),2,
                         (void *)((long)outData + (long)iVar2),pErrorCode);
      (*ds->swapInvChars)(ds,(void *)((long)inData + (long)iVar2 + 2),5,
                          (void *)((long)outData + (long)iVar2 + 2),pErrorCode);
    }
    return iVar2 + 7;
  }
  udata_printError_63(ds,
                      "test_swap(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as testdata\n"
                      ,(ulong)*(byte *)((long)inData + 0xc),(ulong)*(byte *)((long)inData + 0xd),
                      (ulong)*(byte *)((long)inData + 0xe),(ulong)*(byte *)((long)inData + 0xf),
                      (uint)*(byte *)((long)inData + 0x10));
  *pErrorCode = U_UNSUPPORTED_ERROR;
  return 0;
}

Assistant:

static int32_t U_CALLCONV
test_swap(const UDataSwapper *ds,
           const void *inData, int32_t length, void *outData,
           UErrorCode *pErrorCode) {
    const UDataInfo *pInfo;
    int32_t headerSize;

    const uint8_t *inBytes;
    uint8_t *outBytes;

    int32_t offset;

    /* udata_swapDataHeader checks the arguments */
    headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(pErrorCode==NULL || U_FAILURE(*pErrorCode)) {
        udata_printError(ds, "test_swap(): data header swap failed %s\n", pErrorCode != NULL ? u_errorName(*pErrorCode) : "pErrorCode is NULL");
        return 0;
    }

    /* check data format and format version */
    pInfo=(const UDataInfo *)((const char *)inData+4);
    if(!(
        pInfo->dataFormat[0]==0x54 &&   /* dataFormat="Norm" */
        pInfo->dataFormat[1]==0x65 &&
        pInfo->dataFormat[2]==0x73 &&
        pInfo->dataFormat[3]==0x74 &&
        pInfo->formatVersion[0]==1
    )) {
        udata_printError(ds, "test_swap(): data format %02x.%02x.%02x.%02x (format version %02x) is not recognized as testdata\n",
                         pInfo->dataFormat[0], pInfo->dataFormat[1],
                         pInfo->dataFormat[2], pInfo->dataFormat[3],
                         pInfo->formatVersion[0]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    inBytes=(const uint8_t *)inData+headerSize;
    outBytes=(uint8_t *)outData+headerSize;

    int32_t size16 = 2; // 16bit plus padding
    int32_t sizeStr = 5; // 4 char inv-str plus null
    int32_t size = size16 + sizeStr;

    if(length>=0) {
        if(length<size) {
            udata_printError(ds, "test_swap(): too few bytes (%d after header, wanted %d) for all of testdata\n",
                             length, size);
            *pErrorCode=U_INDEX_OUTOFBOUNDS_ERROR;
            return 0;
        }

	offset =0;
	/* swap a 1 entry array */
        ds->swapArray16(ds, inBytes+offset, size16, outBytes+offset, pErrorCode);
	offset+=size16;
	ds->swapInvChars(ds, inBytes+offset, sizeStr, outBytes+offset, pErrorCode);
    }

    return headerSize+size;
}